

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O0

ChaiScript_Basic * __thiscall
chaiscript::ChaiScript_Basic::set_global(ChaiScript_Basic *this,Boxed_Value *t_bv,string *t_name)

{
  string local_50;
  Boxed_Value local_30;
  string *local_20;
  string *t_name_local;
  Boxed_Value *t_bv_local;
  ChaiScript_Basic *this_local;
  
  local_20 = t_name;
  t_name_local = (string *)t_bv;
  t_bv_local = (Boxed_Value *)this;
  Name_Validator::validate_object_name<std::__cxx11::string>(t_name);
  Boxed_Value::Boxed_Value(&local_30,(Boxed_Value *)t_name_local);
  std::__cxx11::string::string((string *)&local_50,local_20);
  detail::Dispatch_Engine::set_global(&this->m_engine,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  Boxed_Value::~Boxed_Value(&local_30);
  return this;
}

Assistant:

ChaiScript_Basic &set_global(const Boxed_Value &t_bv, const std::string &t_name) {
      Name_Validator::validate_object_name(t_name);
      m_engine.set_global(t_bv, t_name);
      return *this;
    }